

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  uint uVar1;
  CompilerError *this_00;
  char (*pacVar2) [12];
  char (*ts_1) [13];
  char (*in_R9) [2];
  float value;
  float fVar3;
  string local_400;
  diligent_spirv_cross local_3e0 [32];
  string local_3c0;
  undefined1 local_3a0 [8];
  SPIRType type_1;
  string local_230;
  diligent_spirv_cross local_210 [32];
  string local_1f0;
  diligent_spirv_cross local_1d0 [32];
  string local_1b0;
  undefined1 local_190 [8];
  SPIRType type;
  float float_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  value = SPIRConstant::scalar_f16(c,col,row);
  uVar1 = ::std::isnan((double)(ulong)(uint)value);
  if (((uVar1 & 1) == 0) && (uVar1 = ::std::isinf((double)(ulong)(uint)value), (uVar1 & 1) == 0)) {
    SPIRType::SPIRType((SPIRType *)local_3a0,OpTypeFloat);
    type_1.super_IVariant.self.id = 0xc;
    type_1.basetype = Void;
    type_1.width = 1;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_3e0,this,local_3a0,0);
    format_float_abi_cxx11_(&local_400,this,value);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_3c0,local_3e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075,
               (char (*) [2])&local_400,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3c0);
    ::std::__cxx11::string::~string((string *)&local_3c0);
    ::std::__cxx11::string::~string((string *)&local_400);
    ::std::__cxx11::string::~string((string *)local_3e0);
    SPIRType::~SPIRType((SPIRType *)local_3a0);
  }
  else {
    SPIRType::SPIRType((SPIRType *)local_190,OpTypeFloat);
    type.super_IVariant.self.id = 0xc;
    type.basetype = Void;
    type.width = 1;
    fVar3 = ::std::numeric_limits<float>::infinity();
    if ((value != fVar3) || (NAN(value) || NAN(fVar3))) {
      fVar3 = ::std::numeric_limits<float>::infinity();
      if ((value != -fVar3) || (NAN(value) || NAN(-fVar3))) {
        uVar1 = ::std::isnan((double)(ulong)(uint)value);
        if ((uVar1 & 1) == 0) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,"Cannot represent non-finite floating point constant.");
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        pacVar2 = (char (*) [12])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])
                  (&type_1.member_name_cache._M_h._M_single_bucket,this,local_190);
        join<std::__cxx11::string,char_const(&)[12]>
                  (&local_230,
                   (diligent_spirv_cross *)&type_1.member_name_cache._M_h._M_single_bucket,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(0.0 / 0.0)",pacVar2);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_230);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::string::~string((string *)&type_1.member_name_cache._M_h._M_single_bucket);
      }
      else {
        ts_1 = (char (*) [13])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_210,this,local_190);
        join<std::__cxx11::string,char_const(&)[13]>
                  (&local_1f0,local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(-1.0 / 0.0)",ts_1);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)local_210);
      }
    }
    else {
      pacVar2 = (char (*) [12])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1d0,this,local_190);
      join<std::__cxx11::string,char_const(&)[12]>
                (&local_1b0,local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(1.0 / 0.0)",
                 pacVar2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)local_1d0);
    }
    SPIRType::~SPIRType((SPIRType *)local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", format_float(float_value), ")");
	}

	return res;
}